

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Parser::_filter_ws<true>(Parser *this,substr r,size_t *i,size_t *pos)

{
  char cVar1;
  char *pcVar2;
  code *pcVar3;
  Location LVar4;
  bool bVar5;
  ulong uVar6;
  size_t sVar7;
  size_t j;
  ulong start;
  ro_substr chars;
  char msg [44];
  basic_substring<char> local_a0;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  char *pcStack_78;
  undefined8 local_70;
  char local_68 [56];
  
  local_a0.len = r.len;
  local_a0.str = r.str;
  start = *i;
  if (local_a0.len <= start) {
    if ((s_error_flags & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    handle_error(0x1fe047,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x14c3,"i >= 0 && i < len");
  }
  cVar1 = local_a0.str[start];
  if ((cVar1 != '\t') && (cVar1 != ' ')) {
    builtin_strncpy(local_68 + 0x20,"rr == \'\\t\')",0xc);
    builtin_strncpy(local_68 + 0x10,"urr == \' \' || cu",0x10);
    builtin_strncpy(local_68,"check failed: (c",0x10);
    if ((s_error_flags & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    local_90 = 0;
    uStack_88 = 0x7bf3;
    local_80 = 0;
    pcStack_78 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_70 = 0x65;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x7bf3) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x7bf3) << 0x40,8);
    LVar4.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar4.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_68,0x2c,LVar4,(this->m_stack).m_callbacks.m_user_data);
  }
  if (start == 0) {
    uVar6 = basic_substring<char>::first_not_of(&local_a0,' ',0);
  }
  else {
    chars.len = 2;
    chars.str = " \t";
    uVar6 = basic_substring<char>::first_not_of(&local_a0,chars,start);
  }
  if (uVar6 == 0xffffffffffffffff) {
    if (start < local_a0.len) {
      sVar7 = *pos;
      do {
        (this->m_filter_arena).str[sVar7] = local_a0.str[start];
        sVar7 = sVar7 + 1;
        start = start + 1;
      } while (start < local_a0.len);
      *pos = sVar7;
    }
    *i = local_a0.len;
  }
  else {
    if (local_a0.len <= uVar6) {
      if ((s_error_flags & 1) != 0) {
        bVar5 = is_debugger_attached();
        if (bVar5) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
      }
      handle_error(0x1fe047,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x14c3,"i >= 0 && i < len");
    }
    if ((local_a0.str[uVar6] == '\r') || (local_a0.str[uVar6] == '\n')) {
      *i = uVar6 - 1;
    }
    else {
      pcVar2 = (this->m_filter_arena).str;
      sVar7 = *pos;
      *pos = sVar7 + 1;
      pcVar2[sVar7] = cVar1;
    }
  }
  return;
}

Assistant:

void Parser::_filter_ws(substr r, size_t *C4_RESTRICT i, size_t *C4_RESTRICT pos)
{
    // a debugging scaffold:
    #if 0
    #define _c4dbgfws(fmt, ...) _c4dbgpf("filt_nl[{}]: " fmt, *i, __VA_ARGS__)
    #else
    #define _c4dbgfws(...)
    #endif

    const char curr = r[*i];
    _c4dbgfws("found whitespace '{}'", _c4prc(curr));
    _RYML_CB_ASSERT(m_stack.m_callbacks, curr == ' ' || curr == '\t');

    size_t first = *i > 0 ? r.first_not_of(" \t", *i) : r.first_not_of(' ', *i);
    if(first != npos)
    {
        if(r[first] == '\n' || r[first] == '\r') // skip trailing whitespace
        {
            _c4dbgfws("whitespace is trailing on line. firstnonws='{}'@{}", _c4prc(r[first]), first);
            *i = first - 1; // correct for the loop increment
        }
        else // a legit whitespace
        {
            m_filter_arena.str[(*pos)++] = curr;
            _c4dbgfws("legit whitespace. sofar=[{}]~~~{}~~~", *pos, m_filter_arena.first(*pos));
        }
    }
    else
    {
        _c4dbgfws("... everything else is trailing whitespace{}", "");
        if C4_IF_CONSTEXPR (keep_trailing_whitespace)
            for(size_t j = *i; j < r.len; ++j)
                m_filter_arena.str[(*pos)++] = r[j];
        *i = r.len;
    }

    #undef _c4dbgfws
}